

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void swrenderer::R_ClearPlanes(bool fullclear)

{
  visplane_s *pvVar1;
  WORD local_28;
  visplane_t *vis;
  visplane_t **probe;
  int i;
  bool fullclear_local;
  
  if (fullclear) {
    for (probe._0_4_ = 0; (int)probe < 0x81; probe._0_4_ = (int)probe + 1) {
      *(undefined8 *)freehead = *(undefined8 *)(visplanes + (long)(int)probe * 8);
      *(undefined8 *)(visplanes + (long)(int)probe * 8) = 0;
      for (; *(long *)freehead != 0; freehead = *(undefined **)freehead) {
      }
    }
    fillshort(floorclip,viewwidth,(WORD)viewheight);
    if ((((screen->Accel2D & 1U) == 0) && (viewwindowy < ConBottom)) &&
       ((bRenderingToCanvas & 1) == 0)) {
      local_28 = (short)ConBottom - (short)viewwindowy;
    }
    else {
      local_28 = 0;
    }
    fillshort(ceilingclip,viewwidth,local_28);
    lastopening = 0;
  }
  else {
    for (probe._0_4_ = 0; (int)probe < 0x80; probe._0_4_ = (int)probe + 1) {
      vis = (visplane_t *)(visplanes + (long)(int)probe * 8);
      while (vis->next != (visplane_s *)0x0) {
        if (vis->next->sky < 0) {
          vis = vis->next;
        }
        else {
          pvVar1 = vis->next;
          *(visplane_s **)freehead = pvVar1;
          vis->next = pvVar1->next;
          pvVar1->next = (visplane_s *)0x0;
          freehead = (undefined *)pvVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void R_ClearPlanes (bool fullclear)
{
	int i;

	// Don't clear fake planes if not doing a full clear.
	if (!fullclear)
	{
		for (i = 0; i <= MAXVISPLANES-1; i++)	// new code -- killough
		{
			for (visplane_t **probe = &visplanes[i]; *probe != NULL; )
			{
				if ((*probe)->sky < 0)
				{ // fake: move past it
					probe = &(*probe)->next;
				}
				else
				{ // not fake: move to freelist
					visplane_t *vis = *probe;
					*freehead = vis;
					*probe = vis->next;
					vis->next = NULL;
					freehead = &vis->next;
				}
			}
		}
	}
	else
	{
		for (i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
		{
			for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
			{
				freehead = &(*freehead)->next;
			}
		}

		// opening / clipping determination
		fillshort (floorclip, viewwidth, viewheight);
		// [RH] clip ceiling to console bottom
		fillshort (ceilingclip, viewwidth,
			!screen->Accel2D && ConBottom > viewwindowy && !bRenderingToCanvas
			? (ConBottom - viewwindowy) : 0);

		lastopening = 0;
	}
}